

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_aggregate_optimizer.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::DistinctWindowedOptimizer::Apply
          (DistinctWindowedOptimizer *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  reference pvVar1;
  BoundWindowExpression *pBVar2;
  pointer pAVar3;
  undefined7 in_register_00000081;
  
  pvVar1 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar2 = BaseExpression::Cast<duckdb::BoundWindowExpression>
                     (&pvVar1->_M_data->super_BaseExpression);
  if ((pBVar2->distinct == true) &&
     ((pBVar2->aggregate).
      super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
      .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl !=
      (AggregateFunction *)0x0)) {
    pAVar3 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
             ::operator->(&pBVar2->aggregate);
    if (pAVar3->distinct_dependent == NOT_DISTINCT_DEPENDENT) {
      pBVar2->distinct = false;
      *(undefined1 *)CONCAT71(in_register_00000081,is_root) = 1;
    }
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> DistinctWindowedOptimizer::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                        bool &changes_made, bool is_root) {
	auto &wexpr = bindings[0].get().Cast<BoundWindowExpression>();
	return Apply(rewriter.context, wexpr, changes_made);
}